

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdIOCallback.cpp
# Opt level: O3

int __thiscall libebml::StdIOCallback::close(StdIOCallback *this,int __fd)

{
  int in_EAX;
  int iVar1;
  CRTError *this_00;
  int *piVar2;
  stringstream Msg;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if ((FILE *)this->File != (FILE *)0x0) {
    iVar1 = fclose((FILE *)this->File);
    if (iVar1 != 0) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(local_190,"Can\'t close file ",0x11);
      std::ostream::_M_insert<void_const*>(local_190);
      this_00 = (CRTError *)__cxa_allocate_exception(0x18);
      std::__cxx11::stringbuf::str();
      piVar2 = __errno_location();
      CRTError::CRTError(this_00,&local_1c0,*piVar2);
      __cxa_throw(this_00,&CRTError::typeinfo,std::runtime_error::~runtime_error);
    }
    this->File = (FILE *)0x0;
    in_EAX = 0;
  }
  return in_EAX;
}

Assistant:

void StdIOCallback::close()
{
  if(File==0)
    return;

  if(fclose(File)!=0) {
#if !defined(__GNUC__) || (__GNUC__ > 2)
    stringstream Msg;
    Msg<<"Can't close file "<<File;
    throw CRTError(Msg.str());
#endif // GCC2
  }

  File=0;
}